

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

void duckdb::TimeBucketOriginFunction<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  interval_t bucket_width_00;
  VectorType VVar1;
  bool bVar2;
  date_t *pdVar3;
  interval_t *piVar4;
  NotImplementedException *this;
  Vector *in_RDX;
  DataChunk *in_RDI;
  BucketWidthType bucket_width_type;
  interval_t bucket_width;
  value_type *origin_arg;
  value_type *ts_arg;
  value_type *bucket_width_arg;
  _func_date_t_interval_t_date_t_date_t_ValidityMask_ptr_unsigned_long *in_stack_fffffffffffffec8;
  vector<duckdb::Vector,_true> *in_stack_fffffffffffffed0;
  reference count;
  Vector *in_stack_fffffffffffffed8;
  reference result_00;
  Vector *in_stack_fffffffffffffee0;
  Vector *c;
  Vector *in_stack_fffffffffffffee8;
  Vector *in_stack_fffffffffffffef0;
  allocator local_89;
  string local_88 [32];
  undefined8 local_68;
  int64_t iStack_60;
  BucketWidthType local_49;
  undefined8 local_48;
  int64_t iStack_40;
  int32_t local_34;
  Vector *local_30;
  reference local_28;
  reference local_20;
  Vector *local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
  local_30 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
  VVar1 = Vector::GetVectorType(local_20);
  if ((VVar1 == CONSTANT_VECTOR) &&
     (VVar1 = Vector::GetVectorType(local_30), VVar1 == CONSTANT_VECTOR)) {
    bVar2 = ConstantVector::IsNull((Vector *)0xbe47d3);
    if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0xbe47e4), !bVar2)) {
      pdVar3 = ConstantVector::GetData<duckdb::date_t>((Vector *)0xbe47f5);
      local_34 = pdVar3->days;
      bVar2 = duckdb::Value::IsFinite<duckdb::date_t>((date_t)local_34);
      if (bVar2) {
        piVar4 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xbe4844);
        local_68._0_4_ = piVar4->months;
        local_68._4_4_ = piVar4->days;
        iStack_60 = piVar4->micros;
        bucket_width_00.micros = (int64_t)in_stack_fffffffffffffec8;
        bucket_width_00.months = 0xbe4874;
        bucket_width_00.days = 0;
        local_48 = local_68;
        iStack_40 = iStack_60;
        local_49 = TimeBucket::ClassifyBucketWidth(bucket_width_00);
        if (local_49 == CONVERTIBLE_TO_MICROS) {
          DataChunk::size(local_8);
          TernaryExecutor::
          Execute<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t)>
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0,
                     (_func_date_t_interval_t_date_t_date_t *)in_stack_fffffffffffffec8);
          return;
        }
        if (local_49 != CONVERTIBLE_TO_MONTHS) {
          if (local_49 == UNCLASSIFIED) {
            DataChunk::size(local_8);
            TernaryExecutor::
            ExecuteWithNulls<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0
                       ,in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffec8);
            return;
          }
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_88,"Bucket type not implemented for TIME_BUCKET",&local_89);
          duckdb::NotImplementedException::NotImplementedException(this,local_88);
          __cxa_throw(this,&NotImplementedException::typeinfo,
                      NotImplementedException::~NotImplementedException);
        }
        DataChunk::size(local_8);
        TernaryExecutor::
        Execute<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t)>
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0,
                   (_func_date_t_interval_t_date_t_date_t *)in_stack_fffffffffffffec8);
        return;
      }
    }
    duckdb::Vector::SetVectorType((VectorType)local_18);
    duckdb::ConstantVector::SetNull(local_18,true);
  }
  else {
    count = local_20;
    result_00 = local_28;
    c = local_30;
    DataChunk::size(local_8);
    TernaryExecutor::
    ExecuteWithNulls<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
              (in_stack_fffffffffffffef0,local_18,c,result_00,(idx_t)count,in_stack_fffffffffffffec8
              );
  }
  return;
}

Assistant:

static void TimeBucketOriginFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &origin_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR &&
	    origin_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg) || ConstantVector::IsNull(origin_arg) ||
		    !Value::IsFinite(*ConstantVector::GetData<T>(origin_arg))) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
		    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
		    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
	}
}